

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

Status cmsys::SystemTools::SetPermissions(char *file,mode_t mode,bool honor_umask)

{
  Status SVar1;
  allocator<char> local_39;
  string local_38;
  
  if (file == (char *)0x0) {
    SVar1.Kind_ = POSIX;
    SVar1.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x16;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,file,&local_39);
    SVar1 = SetPermissions(&local_38,mode,honor_umask);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return SVar1;
}

Assistant:

Status SystemTools::SetPermissions(const char* file, mode_t mode,
                                   bool honor_umask)
{
  if (!file) {
    return Status::POSIX(EINVAL);
  }
  return SystemTools::SetPermissions(std::string(file), mode, honor_umask);
}